

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::util_time_GetTime::test_method(util_time_GetTime *this)

{
  time_point tVar1;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar2;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar3;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar4;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar5;
  long lVar6;
  long lVar7;
  iterator in_R8;
  iterator pvVar8;
  value_type *in_R9;
  value_type *pvVar9;
  value_type *pvVar10;
  iterator pvVar11;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  check_type cVar12;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  duration local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  value_type local_a4 [4];
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  duration *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  SetMockTime(0x6f);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_50._1_7_ = 0;
  local_50.m_message.px = (element_type *)&DAT_00000001;
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
    local_90._vptr_lazy_ostream =
         (_func_int **)(*(long *)(&local_50.p_predicate_value + lVar7) * 1000);
    UninterruptibleSleep((microseconds *)&local_90);
    local_60 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_58 = "";
    local_70 = &boost::unit_test::basic_cstring<char_const>::null;
    local_68 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x21a;
    file.m_begin = (iterator)&local_60;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_70,msg);
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = (duration *)0xc694e1;
    local_a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_98 = "";
    local_a4[0] = 'o';
    local_a4[1] = '\0';
    local_a4[2] = '\0';
    local_a4[3] = '\0';
    local_228.__r = GetTime();
    pvVar8 = (iterator)0x2;
    pvVar9 = local_a4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (&local_90,&local_a0,0x21a,1,2,pvVar9,"111",&local_228,"GetTime()");
    local_b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_b0 = "";
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar9;
    msg_00.m_begin = pvVar8;
    file_00.m_end = (iterator)0x21b;
    file_00.m_begin = (iterator)&local_b8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c8,
               msg_00);
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = (duration *)0xc694e1;
    local_d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_d0 = "";
    local_a4[0] = 'o';
    local_a4[1] = '\0';
    local_a4[2] = '\0';
    local_a4[3] = '\0';
    local_228.__r =
         (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ();
    pvVar8 = (iterator)0x2;
    pvVar9 = local_a4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (&local_90,&local_d8,0x21b,1,2,pvVar9,"111",&local_228,
               "Now<NodeSeconds>().time_since_epoch().count()");
    local_e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_e0 = "";
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = pvVar9;
    msg_01.m_begin = pvVar8;
    file_01.m_end = (iterator)0x21c;
    file_01.m_begin = (iterator)&local_e8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_f8,
               msg_01);
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = (duration *)0xc694e1;
    local_108 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_100 = "";
    local_a4[0] = 'o';
    local_a4[1] = '\0';
    local_a4[2] = '\0';
    local_a4[3] = '\0';
    tVar1 = NodeClock::now();
    local_228.__r = (long)tVar1.__d.__r / 1000000000;
    pvVar8 = (iterator)0x2;
    pvVar9 = local_a4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (&local_90,&local_108,0x21c,1,2,pvVar9,"111",&local_228,
               "TicksSinceEpoch<std::chrono::seconds>(NodeClock::now())");
    local_118 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_110 = "";
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    local_120 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = pvVar9;
    msg_02.m_begin = pvVar8;
    file_02.m_end = (iterator)0x21d;
    file_02.m_begin = (iterator)&local_118;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_128,
               msg_02);
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = (duration *)0xc694e1;
    local_138 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_130 = "";
    local_a4[0] = 'o';
    local_a4[1] = '\0';
    local_a4[2] = '\0';
    local_a4[3] = '\0';
    tVar2 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    local_228.__r = (rep)(double)tVar2.__d.__r;
    pvVar8 = (iterator)0x2;
    pvVar9 = local_a4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,double>
              (&local_90,&local_138,0x21d,1,2,pvVar9,"111",&local_228,
               "TicksSinceEpoch<SecondsDouble>(Now<NodeSeconds>())");
    local_148 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_140 = "";
    local_158 = &boost::unit_test::basic_cstring<char_const>::null;
    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_03.m_end = pvVar9;
    msg_03.m_begin = pvVar8;
    file_03.m_end = (iterator)0x21e;
    file_03.m_begin = (iterator)&local_148;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_158,
               msg_03);
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = (duration *)0xc694e1;
    local_168 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_160 = "";
    local_a4[0] = 'o';
    local_a4[1] = '\0';
    local_a4[2] = '\0';
    local_a4[3] = '\0';
    local_228.__r =
         (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ();
    pvVar8 = (iterator)0x2;
    pvVar9 = local_a4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (&local_90,&local_168,0x21e,1,2,pvVar9,"111",&local_228,
               "GetTime<std::chrono::seconds>().count()");
    local_178 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_170 = "";
    local_188 = &boost::unit_test::basic_cstring<char_const>::null;
    local_180 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = pvVar9;
    msg_04.m_begin = pvVar8;
    file_04.m_end = (iterator)0x21f;
    file_04.m_begin = (iterator)&local_178;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_188,
               msg_04);
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = (duration *)0xc694e1;
    local_198 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_190 = "";
    local_a4[0] = -0x68;
    local_a4[1] = -0x4f;
    local_a4[2] = '\x01';
    local_a4[3] = '\0';
    local_228.__r =
         (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000l>>>>
                        ();
    pvVar8 = (iterator)0x2;
    pvVar9 = local_a4;
    pvVar10 = pvVar9;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (&local_90,&local_198,0x21f,1,2,pvVar9,"111000",&local_228,
               "GetTime<std::chrono::milliseconds>().count()");
    local_1a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_1a0 = "";
    local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = pvVar10;
    msg_05.m_begin = pvVar8;
    file_05.m_end = (iterator)0x220;
    file_05.m_begin = (iterator)&local_1a8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1b8,
               msg_05);
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = (duration *)0xc694e1;
    local_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_1c0 = "";
    local_a4[0] = -0x68;
    local_a4[1] = -0x4f;
    local_a4[2] = '\x01';
    local_a4[3] = '\0';
    tVar1 = NodeClock::now();
    local_228.__r = (long)tVar1.__d.__r / 1000000;
    pvVar8 = (iterator)0x2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (&local_90,&local_1c8,0x220,1,2,pvVar9,"111000",&local_228,
               "TicksSinceEpoch<std::chrono::milliseconds>(NodeClock::now())");
    local_1d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_1d0 = "";
    local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = pvVar9;
    msg_06.m_begin = pvVar8;
    file_06.m_end = (iterator)0x221;
    file_06.m_begin = (iterator)&local_1d8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1e8,
               msg_06);
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = (duration *)0xc694e1;
    local_1f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_1f0 = "";
    local_a4[0] = -0x40;
    local_a4[1] = -0x47;
    local_a4[2] = -99;
    local_a4[3] = '\x06';
    local_228.__r =
         (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                        ();
    in_R9 = local_a4;
    in_R8 = (iterator)0x2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (&local_90,&local_1f8,0x221,1,2,in_R9,"111000000",&local_228,
               "GetTime<std::chrono::microseconds>().count()");
  }
  SetMockTime(0);
  tVar2 = Now<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000l>>>>
                    ();
  lVar7 = std::chrono::_V2::steady_clock::now();
  tVar3 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000l>>>>()
  ;
  tVar4 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                    ();
  local_90._vptr_lazy_ostream = (_func_int **)0x3e8;
  UninterruptibleSleep((microseconds *)&local_90);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = in_R9;
  msg_07.m_begin = in_R8;
  file_07.m_end = (iterator)0x22b;
  file_07.m_begin = (iterator)&local_208;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_218,
             msg_07);
  _cVar12 = 0x59b8a9;
  tVar5 = Now<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000l>>>>
                    ();
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_228.__r = 0xc6ad53;
  local_220 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_230 = "";
  pvVar8 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  local_78 = &local_228;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((long)tVar2.__d.__r < (long)tVar5.__d.__r)
  ;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_90,1,0,WARN,_cVar12,(size_t)&local_238,0x22b,tVar3.__d.__r,
             tVar4.__d.__r);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar11;
  msg_08.m_begin = pvVar8;
  file_08.m_end = (iterator)0x22c;
  file_08.m_begin = (iterator)&local_248;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_258,
             msg_08);
  _cVar12 = 0x59b98f;
  lVar6 = std::chrono::_V2::steady_clock::now();
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(lVar7 + 1000000 <= lVar6);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_228.__r = 0xc6ad7b;
  local_220 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_260 = "";
  pvVar8 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  local_78 = &local_228;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_90,1,0,WARN,_cVar12,(size_t)&local_268,0x22c);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar11;
  msg_09.m_begin = pvVar8;
  file_09.m_end = (iterator)0x22d;
  file_09.m_begin = (iterator)&local_278;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_288,
             msg_09);
  _cVar12 = 0x59ba6a;
  tVar2 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000l>>>>()
  ;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((long)tVar3.__d.__r < (long)tVar2.__d.__r);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_228.__r = 0xc6adae;
  local_220 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_290 = "";
  pvVar8 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  local_78 = &local_228;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_90,1,0,WARN,_cVar12,(size_t)&local_298,0x22d);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar11;
  msg_10.m_begin = pvVar8;
  file_10.m_end = (iterator)0x22e;
  file_10.m_begin = (iterator)&local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2b8,
             msg_10);
  _cVar12 = 0x59bb3f;
  tVar2 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                    ();
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((long)tVar4.__d.__r < (long)tVar2.__d.__r)
  ;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_228.__r = 0xc6adda;
  local_220 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2c0 = "";
  local_78 = &local_228;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_90,1,0,WARN,_cVar12,(size_t)&local_2c8,0x22e);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_time_GetTime)
{
    SetMockTime(111);
    // Check that mock time does not change after a sleep
    for (const auto& num_sleep : {0ms, 1ms}) {
        UninterruptibleSleep(num_sleep);
        BOOST_CHECK_EQUAL(111, GetTime()); // Deprecated time getter
        BOOST_CHECK_EQUAL(111, Now<NodeSeconds>().time_since_epoch().count());
        BOOST_CHECK_EQUAL(111, TicksSinceEpoch<std::chrono::seconds>(NodeClock::now()));
        BOOST_CHECK_EQUAL(111, TicksSinceEpoch<SecondsDouble>(Now<NodeSeconds>()));
        BOOST_CHECK_EQUAL(111, GetTime<std::chrono::seconds>().count());
        BOOST_CHECK_EQUAL(111000, GetTime<std::chrono::milliseconds>().count());
        BOOST_CHECK_EQUAL(111000, TicksSinceEpoch<std::chrono::milliseconds>(NodeClock::now()));
        BOOST_CHECK_EQUAL(111000000, GetTime<std::chrono::microseconds>().count());
    }

    SetMockTime(0);
    // Check that steady time and system time changes after a sleep
    const auto steady_ms_0 = Now<SteadyMilliseconds>();
    const auto steady_0 = std::chrono::steady_clock::now();
    const auto ms_0 = GetTime<std::chrono::milliseconds>();
    const auto us_0 = GetTime<std::chrono::microseconds>();
    UninterruptibleSleep(1ms);
    BOOST_CHECK(steady_ms_0 < Now<SteadyMilliseconds>());
    BOOST_CHECK(steady_0 + 1ms <= std::chrono::steady_clock::now());
    BOOST_CHECK(ms_0 < GetTime<std::chrono::milliseconds>());
    BOOST_CHECK(us_0 < GetTime<std::chrono::microseconds>());
}